

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O3

void print_statdiff(char *prefix,char *fmt,long oldv,long newv)

{
  ulong in_RAX;
  attr_t attr;
  wchar_t col;
  undefined8 local_28;
  
  local_28 = in_RAX;
  if ((prefix != (char *)0x0) && (*prefix != '\0')) {
    waddnstr(statuswin,prefix,0xffffffff);
  }
  status_change_color_on((wchar_t *)((long)&local_28 + 4),(attr_t *)&local_28,oldv,0,newv,0);
  wprintw(statuswin,fmt,newv);
  if (local_28._4_4_ != 0) {
    wattr_off(statuswin,local_28 & 0xffffffff,0);
    return;
  }
  return;
}

Assistant:

static void print_statdiff(const char *prefix, const char *fmt,
			   long oldv, long newv)
{
    int col;
    attr_t attr;

    if (prefix && prefix[0])
	waddstr(statuswin, prefix);
    status_change_color_on(&col, &attr, oldv, 0, newv, 0);
    wprintw(statuswin, fmt, newv);
    status_change_color_off(col, attr);
}